

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O2

void Fra_ClauRemapClause(int *pMap,Vec_Int_t *vClause,Vec_Int_t *vRemapped,int fInv)

{
  uint uVar1;
  int i;
  
  vRemapped->nSize = 0;
  i = 0;
  while( true ) {
    if (vClause->nSize <= i) {
      return;
    }
    uVar1 = Vec_IntEntry(vClause,i);
    if (pMap[(int)uVar1 >> 1] < 0) break;
    Vec_IntPush(vRemapped,(uint)((uVar1 & 1) != fInv) + pMap[(int)uVar1 >> 1] * 2);
    i = i + 1;
  }
  __assert_fail("pMap[lit_var(iLit)] >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClau.c"
                ,0x198,"void Fra_ClauRemapClause(int *, Vec_Int_t *, Vec_Int_t *, int)");
}

Assistant:

void Fra_ClauRemapClause( int * pMap, Vec_Int_t * vClause, Vec_Int_t * vRemapped, int fInv )
{
    int iLit, i;
    Vec_IntClear( vRemapped );
    Vec_IntForEachEntry( vClause, iLit, i )
    {
        assert( pMap[lit_var(iLit)] >= 0 );
        iLit = toLitCond( pMap[lit_var(iLit)], lit_sign(iLit) ^ fInv );
        Vec_IntPush( vRemapped, iLit );
    }
}